

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O3

bool __thiscall
vkt::image::anon_unknown_2::BinaryAtomicEndResultInstance::verifyResult
          (BinaryAtomicEndResultInstance *this,Allocation *outputBufferAllocation)

{
  AtomicOperation AVar1;
  int iVar2;
  ChannelOrder CVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int y;
  int iVar8;
  ChannelOrder CVar9;
  ChannelOrder CVar10;
  ChannelOrder CVar11;
  ChannelOrder CVar12;
  ChannelOrder CVar13;
  int iVar14;
  UVec3 gridSize;
  ConstPixelBufferAccess resultBuffer;
  int local_a4;
  int local_a0;
  int local_9c;
  ChannelOrder local_98;
  int local_74;
  int local_70;
  int local_6c;
  ConstPixelBufferAccess local_68;
  ChannelOrder local_40;
  
  getShaderGridSize((image *)&local_74,(this->super_BinaryAtomicInstanceBase).m_imageType,
                    &(this->super_BinaryAtomicInstanceBase).m_imageSize);
  iVar2 = local_74;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_68,&(this->super_BinaryAtomicInstanceBase).m_format,local_74,local_70,local_6c,
             outputBufferAllocation->m_hostPtr);
  if (0 < local_68.m_size.m_data[2]) {
    local_98 = R;
    local_9c = 0;
    local_a4 = 0;
    iVar6 = local_68.m_size.m_data[2];
    iVar14 = local_68.m_size.m_data[1];
    do {
      if (0 < iVar14) {
        local_a0 = 0;
        iVar8 = local_68.m_size.m_data[0];
        CVar13 = local_98;
        iVar7 = local_9c;
        do {
          if (0 < iVar8) {
            y = 0;
            CVar12 = CVar13;
            iVar6 = iVar7;
            do {
              tcu::ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)&local_40,(int)&local_68,y,local_a0);
              AVar1 = (this->super_BinaryAtomicInstanceBase).m_operation;
              uVar4 = (ulong)AVar1;
              if (uVar4 < 6) {
                CVar11 = *(ChannelOrder *)(&DAT_00b0bac0 + uVar4 * 4);
                iVar8 = 5;
                CVar9 = CVar12;
                iVar14 = y;
                do {
                  if (AVar1 < ATOMIC_OPERATION_EXCHANGE) {
                    CVar10 = iVar14 * iVar14 + local_a0 * local_a0 + local_a4 * local_a4;
LAB_006fab2c:
                    CVar3 = CVar10;
                    switch(uVar4) {
                    case 0:
                      CVar3 = CVar10 + CVar11;
                      break;
                    case 1:
                      if ((int)CVar11 < (int)CVar10) {
                        CVar3 = CVar11;
                      }
                      break;
                    case 2:
                      if ((int)CVar10 < (int)CVar11) {
                        CVar3 = CVar11;
                      }
                      break;
                    case 3:
                      CVar3 = CVar10 & CVar11;
                      break;
                    case 4:
                      CVar3 = CVar10 | CVar11;
                      break;
                    case 5:
                      CVar3 = CVar10 ^ CVar11;
                      break;
                    default:
                      CVar3 = ~R;
                    }
                  }
                  else {
                    CVar10 = ~R;
                    CVar3 = CVar9;
                    if (AVar1 != ATOMIC_OPERATION_EXCHANGE) goto LAB_006fab2c;
                  }
                  CVar11 = CVar3;
                  iVar14 = iVar14 + local_74;
                  CVar9 = CVar9 + local_70 * local_74;
                  iVar8 = iVar8 + -1;
                } while (iVar8 != 0);
                if (local_40 != CVar11) {
                  return false;
                }
              }
              else if (AVar1 == ATOMIC_OPERATION_EXCHANGE) {
                uVar5 = 0;
                iVar14 = local_40 + iVar6;
                do {
                  iVar8 = iVar14;
                  if (3 < uVar5) break;
                  uVar5 = uVar5 + 1;
                  iVar14 = iVar8 - local_74 * local_70;
                } while (iVar8 != 0);
                if (iVar8 != 0) {
                  return false;
                }
              }
              y = y + 1;
              iVar6 = iVar6 - local_70;
              CVar12 = CVar12 + local_70;
              iVar14 = local_68.m_size.m_data[1];
              iVar8 = local_68.m_size.m_data[0];
            } while (y < local_68.m_size.m_data[0]);
          }
          local_a0 = local_a0 + 1;
          iVar7 = iVar7 + -1;
          CVar13 = CVar13 + A;
          iVar6 = local_68.m_size.m_data[2];
        } while (local_a0 < iVar14);
      }
      local_a4 = local_a4 + 1;
      local_9c = local_9c + iVar2 * local_70 * -5;
      local_98 = local_98 + iVar2 * local_70 * 5;
    } while (local_a4 < iVar6);
  }
  return true;
}

Assistant:

bool BinaryAtomicEndResultInstance::verifyResult (Allocation& outputBufferAllocation) const
{
	const UVec3	gridSize			= getShaderGridSize(m_imageType, m_imageSize);
	const IVec3 extendedGridSize	= IVec3(NUM_INVOCATIONS_PER_PIXEL*gridSize.x(), gridSize.y(), gridSize.z());

	tcu::ConstPixelBufferAccess resultBuffer(m_format, gridSize.x(), gridSize.y(), gridSize.z(), outputBufferAllocation.getHostPtr());

	for (deInt32 z = 0; z < resultBuffer.getDepth();  z++)
	for (deInt32 y = 0; y < resultBuffer.getHeight(); y++)
	for (deInt32 x = 0; x < resultBuffer.getWidth();  x++)
	{
		deInt32 resultValue = resultBuffer.getPixelInt(x, y, z).x();

		if (isOrderIndependentAtomicOperation(m_operation))
		{
			deInt32 reference = getOperationInitialValue(m_operation);

			for (deInt32 i = 0; i < static_cast<deInt32>(NUM_INVOCATIONS_PER_PIXEL); i++)
			{
				const IVec3 gid(x + i*gridSize.x(), y, z);
				reference = computeBinaryAtomicOperationResult(m_operation, reference, getAtomicFuncArgument(m_operation, gid, extendedGridSize));
			}

			if (resultValue != reference)
				return false;
		}
		else if (m_operation == ATOMIC_OPERATION_EXCHANGE)
		{
			// Check if the end result equals one of the atomic args.
			bool matchFound = false;

			for (deInt32 i = 0; i < static_cast<deInt32>(NUM_INVOCATIONS_PER_PIXEL) && !matchFound; i++)
			{
				const IVec3 gid(x + i*gridSize.x(), y, z);
				matchFound = (resultValue == getAtomicFuncArgument(m_operation, gid, extendedGridSize));
			}

			if (!matchFound)
				return false;
		}
		else
			DE_ASSERT(false);
	}
	return true;
}